

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10Texture.cpp
# Opt level: O1

uint32_t __thiscall
GmmLib::GmmGen10TextureCalc::GetAligned3DBlockHeight
          (GmmGen10TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t BlockHeight,
          uint32_t ExpandedArraySize)

{
  uint32_t uVar1;
  GMM_PLATFORM_INFO *pGVar2;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    BlockHeight = 0;
  }
  else {
    pGVar2 = GmmGetPlatformInfo((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext
                               );
    GmmTextureCalc::GetCompressionBlockDimensions
              ((GmmTextureCalc *)this,pTexInfo->Format,&local_30,&local_34,&CompressHeight);
    if ((pTexInfo->Type == RESOURCE_3D) && (((pTexInfo->Flags).Info.field_0x2 & 8) == 0)) {
      uVar1 = pGVar2->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      BlockHeight = -uVar1 & (BlockHeight - 1) + uVar1;
    }
  }
  return BlockHeight;
}

Assistant:

uint32_t GmmLib::GmmGen10TextureCalc::GetAligned3DBlockHeight(GMM_TEXTURE_INFO *pTexInfo,
                                                              uint32_t          BlockHeight,
                                                              uint32_t          ExpandedArraySize)
{
    uint32_t DAlign, CompressHeight, CompressWidth, CompressDepth;
    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, 0);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    DAlign = pTexInfo->Alignment.DAlign;

    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    if(pTexInfo->Type == RESOURCE_3D)
    {
        ExpandedArraySize = GFX_ALIGN_NP2(ExpandedArraySize, DAlign) / CompressDepth;

        if(!pTexInfo->Flags.Info.Linear)
        {
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return BlockHeight;
}